

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_metadata.hpp
# Opt level: O2

void __thiscall
boost::python::objects::register_base_of<SpikesConsumer_python>::operator()
          (register_base_of<SpikesConsumer_python> *this,SpikesConsumer *param_1)

{
  register_dynamic_id<SpikesConsumer>((SpikesConsumer *)0x0);
  register_conversion<SpikesConsumer_python,SpikesConsumer>
            (false,(SpikesConsumer_python *)0x0,(SpikesConsumer *)0x0);
  register_downcast<SpikesConsumer>(0);
  return;
}

Assistant:

inline void operator()(Base*) const
    {
        BOOST_MPL_ASSERT_NOT((boost::python::detail::is_same<Base,Derived>));
        
        // Register the Base class
        register_dynamic_id<Base>();

        // Register the up-cast
        register_conversion<Derived,Base>(false);

        // Register the down-cast, if appropriate.
        this->register_downcast((Base*)0, boost::python::detail::is_polymorphic<Base>());
    }